

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.cpp
# Opt level: O3

block_id_t __thiscall duckdb::ZSTDCompressionState::FinalizePage(ZSTDCompressionState *this)

{
  int iVar1;
  BlockManager *manager_p;
  undefined4 extraout_var;
  pointer pCVar2;
  _Head_base<0UL,_duckdb::CompressedSegmentState_*,_false> local_28;
  block_id_t block_id;
  
  manager_p = PartialBlockManager::GetBlockManager(this->partial_block_manager);
  iVar1 = (*manager_p->_vptr_BlockManager[4])(manager_p);
  block_id = CONCAT44(extraout_var,iVar1);
  pCVar2 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
           operator->(&this->segment);
  local_28._M_head_impl =
       (pCVar2->segment_state).
       super_unique_ptr<duckdb::CompressedSegmentState,_std::default_delete<duckdb::CompressedSegmentState>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::CompressedSegmentState,_std::default_delete<duckdb::CompressedSegmentState>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::CompressedSegmentState_*,_std::default_delete<duckdb::CompressedSegmentState>_>
       .super__Head_base<0UL,_duckdb::CompressedSegmentState_*,_false>._M_head_impl;
  optional_ptr<duckdb::CompressedSegmentState,_true>::CheckValid
            ((optional_ptr<duckdb::CompressedSegmentState,_true> *)&local_28);
  UncompressedStringSegmentState::RegisterBlock
            ((UncompressedStringSegmentState *)local_28._M_head_impl,manager_p,block_id);
  *(block_id_t *)this->current_buffer_ptr = block_id;
  this->current_buffer_ptr = this->current_buffer_ptr + 8;
  return block_id;
}

Assistant:

block_id_t FinalizePage() {
		auto &block_manager = partial_block_manager.GetBlockManager();
		auto new_id = block_manager.GetFreeBlockId();
		auto &state = segment->GetSegmentState()->Cast<UncompressedStringSegmentState>();
		state.RegisterBlock(block_manager, new_id);

		D_ASSERT(GetCurrentOffset() <= GetWritableSpace(info));

		// Write the new id at the end of the last page
		Store<block_id_t>(new_id, current_buffer_ptr);
		current_buffer_ptr += sizeof(block_id_t);
		return new_id;
	}